

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word * Gia_ObjComputeTruthTable(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Wrd_t *pVVar6;
  ulong uVar7;
  Gia_Obj_t *pObj_00;
  word *pwVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  word *pwVar12;
  word Fill;
  long lVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  Gia_Obj_t *pObj_01;
  int iVar17;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    iVar15 = p->vCis->nSize - p->nRegs;
    iVar17 = 1 << ((char)iVar15 - 6U & 0x1f);
    if (iVar15 < 7) {
      iVar17 = 1;
    }
    p->nTtVars = iVar15;
    p->nTtWords = iVar17;
    iVar17 = p->nObjs;
    iVar15 = iVar17 + 1000;
    pVVar4 = Vec_IntAlloc(iVar15);
    pVVar4->nSize = iVar15;
    memset(pVVar4->pArray,0,(long)iVar17 * 4 + 4000);
    p->vTtNums = pVVar4;
    pVVar4 = Vec_IntAlloc(0x100);
    p->vTtNodes = pVVar4;
    iVar17 = 6;
    if (6 < p->nTtVars) {
      iVar17 = p->nTtVars;
    }
    pVVar5 = Vec_PtrAllocTruthTables(iVar17);
    p->vTtInputs = pVVar5;
    pVVar6 = Vec_WrdStart(p->nTtWords << 8);
    p->vTtMemory = pVVar6;
  }
  else if (p->nTtVars != p->vCis->nSize - p->nRegs) {
    __assert_fail("p->nTtVars == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0xf1,"word *Gia_ObjComputeTruthTable(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->vTtNums->nSize < p->nObjs) {
    Vec_IntFillExtra(p->vTtNums,p->nObjs,0);
  }
  uVar7 = *(ulong *)pObj & 0x1fffffff;
  iVar17 = 0;
  uVar9 = 0;
  if (uVar7 != 0x1fffffff) {
    uVar9 = -uVar7;
  }
  pObj_01 = pObj + (uVar9 & (long)(int)*(ulong *)pObj >> 0x1f);
  Gia_ObjCollectInternal(p,pObj_01);
  iVar15 = (p->vTtNodes->nSize + 2) * p->nTtWords;
  if (p->vTtMemory->nSize < iVar15) {
    Vec_WrdFillExtra(p->vTtMemory,iVar15,Fill);
  }
  for (; iVar17 < p->vTtNodes->nSize; iVar17 = iVar17 + 1) {
    iVar15 = Vec_IntEntry(p->vTtNodes,iVar17);
    pObj_00 = Gia_ManObj(p,iVar15);
    if (pObj_00 == (Gia_Obj_t *)0x0) break;
    pObj_00->field_0x3 = pObj_00->field_0x3 & 0xbf;
    pwVar8 = Gla_ObjTruthNode(p,pObj_00);
    iVar15 = p->nTtWords;
    uVar9 = (ulong)((uint)*(undefined8 *)pObj_00 & 0x1fffffff);
    if ((~*(uint *)(pObj_00 + -uVar9) & 0x1fffffff) == 0 || (int)*(uint *)(pObj_00 + -uVar9) < 0) {
      iVar3 = Gia_ObjCioId(pObj_00 + -uVar9);
      pwVar10 = Gla_ObjTruthElem(p,iVar3);
    }
    else {
      pwVar10 = Gla_ObjTruthNode(p,pObj_00 + -uVar9);
    }
    uVar9 = (ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff);
    if ((~*(uint *)(pObj_00 + -uVar9) & 0x1fffffff) == 0 || (int)*(uint *)(pObj_00 + -uVar9) < 0) {
      iVar3 = Gia_ObjCioId(pObj_00 + -uVar9);
      pwVar11 = Gla_ObjTruthElem(p,iVar3);
    }
    else {
      pwVar11 = Gla_ObjTruthNode(p,pObj_00 + -uVar9);
    }
    pwVar12 = pwVar8 + iVar15;
    uVar9 = *(ulong *)pObj_00;
    if (((uint)uVar9 >> 0x1d & 1) == 0) {
      if ((uVar9 >> 0x3d & 1) == 0) {
        for (lVar13 = 0; (word *)(lVar13 + (long)pwVar8) < pwVar12; lVar13 = lVar13 + 8) {
          *(word *)(lVar13 + (long)pwVar8) =
               *(ulong *)((long)pwVar11 + lVar13) & *(ulong *)((long)pwVar10 + lVar13);
        }
      }
      else {
        for (lVar13 = 0; (word *)(lVar13 + (long)pwVar8) < pwVar12; lVar13 = lVar13 + 8) {
          *(word *)(lVar13 + (long)pwVar8) =
               ~*(ulong *)((long)pwVar11 + lVar13) & *(ulong *)((long)pwVar10 + lVar13);
        }
      }
    }
    else if ((uVar9 >> 0x3d & 1) == 0) {
      for (lVar13 = 0; (word *)(lVar13 + (long)pwVar8) < pwVar12; lVar13 = lVar13 + 8) {
        *(word *)(lVar13 + (long)pwVar8) =
             ~*(ulong *)((long)pwVar10 + lVar13) & *(ulong *)((long)pwVar11 + lVar13);
      }
    }
    else {
      for (lVar13 = 0; (word *)(lVar13 + (long)pwVar8) < pwVar12; lVar13 = lVar13 + 8) {
        *(word *)(lVar13 + (long)pwVar8) =
             ~(*(ulong *)((long)pwVar11 + lVar13) | *(ulong *)((long)pwVar10 + lVar13));
      }
    }
  }
  uVar9 = *(ulong *)pObj_01;
  if ((~uVar9 & 0x1fffffff1fffffff) == 0) {
    lVar13 = (long)p->nTtWords;
    pwVar8 = p->vTtMemory->pArray + (p->vTtMemory->nSize - lVar13);
    lVar14 = 0;
    if (lVar13 < 1) {
      lVar13 = lVar14;
    }
    for (; lVar13 != lVar14; lVar14 = lVar14 + 1) {
      pwVar8[lVar14] = 0;
    }
  }
  else {
    if ((~(uint)uVar9 & 0x9fffffff) == 0) {
      iVar17 = Gia_ObjCioId(pObj_01);
      if (iVar17 < p->vCis->nSize - p->nRegs) {
        iVar17 = Gia_ObjCioId(pObj_01);
        pwVar8 = Gla_ObjTruthElem(p,iVar17);
        goto LAB_00614985;
      }
      uVar9 = *(ulong *)pObj_01;
    }
    if ((~(uint)uVar9 & 0x1fffffff) == 0 || (int)(uint)uVar9 < 0) {
      pwVar8 = (word *)0x0;
    }
    else {
      pwVar8 = Gla_ObjTruthNode(p,pObj_01);
    }
  }
LAB_00614985:
  uVar1 = p->nTtWords;
  pwVar10 = p->vTtMemory->pArray + ((long)p->vTtMemory->nSize - (long)(int)(uVar1 * 2));
  uVar2 = *(undefined8 *)pObj;
  uVar16 = (uint)uVar2;
  uVar7 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar7;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    pwVar10[uVar7] =
         pwVar8[uVar7] ^
         -(ulong)((byte)((ulong)uVar2 >> 0x18) >> 5 & (int)uVar16 < 0 & (~uVar16 & 0x1fffffff) != 0)
    ;
  }
  return pwVar10;
}

Assistant:

word * Gia_ObjComputeTruthTable( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pTemp, * pRoot;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i;
    if ( p->vTtMemory == NULL )
    {
        p->nTtVars   = Gia_ManPiNum( p );
        p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
        p->vTtNums   = Vec_IntStart( Gia_ManObjNum(p) + 1000 );
        p->vTtNodes  = Vec_IntAlloc( 256 );
        p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
        p->vTtMemory = Vec_WrdStart( p->nTtWords * 256 );
    }
    else
    {
        // make sure the number of primary inputs did not change 
        // since the truth table computation storage was prepared
        assert( p->nTtVars == Gia_ManPiNum(p) );
    }
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), 0 );
    // collect internal nodes
    pRoot = Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj;
    Gia_ObjCollectInternal( p, pRoot );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Gia_ManForEachObjVec( p->vTtNodes, p, pTemp, i )
    {
        pTemp->fMark0 = 0; // unmark nodes marked by Gia_ObjCollectInternal()
        pTruth  = Gla_ObjTruthNode(p, pTemp);
        pTruthL = pTruth + p->nTtWords;
        pTruth0 = Gia_ObjIsAnd(Gia_ObjFanin0(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin0(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin0(pTemp)) );
        pTruth1 = Gia_ObjIsAnd(Gia_ObjFanin1(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin1(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin1(pTemp)) );
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    // compute the final table
    if ( Gia_ObjIsConst0(pRoot) )
        pTruth = Gla_ObjTruthConst0( p, Gla_ObjTruthFree1(p) );
    else if ( Gia_ObjIsPi(p, pRoot) )
        pTruth = Gla_ObjTruthElem( p, Gia_ObjCioId(pRoot) );
    else if ( Gia_ObjIsAnd(pRoot) )
        pTruth = Gla_ObjTruthNode( p, pRoot );
    else
        pTruth = NULL;
    return Gla_ObjTruthDup( p, Gla_ObjTruthFree2(p), pTruth, Gia_ObjIsCo(pObj) && Gia_ObjFaninC0(pObj) );
}